

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Start_Resume_PDU::Decode(Start_Resume_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x2b < iVar2 + (uint)KVar1) {
    Simulation_Management_Header::Decode
              (&this->super_Simulation_Management_Header,stream,ignoreHeader);
    (*(this->m_RealWorldTime).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_RealWorldTime,stream);
    (*(this->m_SimTime).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_SimTime,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RequestID);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Start_Resume_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < START_RESUME_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RealWorldTime
           >> KDIS_STREAM m_SimTime
           >> m_ui32RequestID;
}